

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::ZhouParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::ZhouParameters> *this,string *id,ZhouParameters *data)

{
  string *in_RDX;
  GenericData *in_RSI;
  ZhouParameters *in_RDI;
  ZhouParameters *unaff_retaddr;
  ZhouParameters *pZVar1;
  
  pZVar1 = in_RDI;
  GenericData::GenericData(in_RSI,in_RDX);
  in_RDI->re = (RealType)&PTR__SimpleTypeData_0046bd10;
  ZhouParameters::ZhouParameters(unaff_retaddr,pZVar1);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}